

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O1

int ZXing::DataMatrix::DMTextEncoder::EncodeChar(int c,string *sb)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = 0;
  for (uVar1 = c;
      ((cVar2 = (char)sb, c + iVar4 != 0x20 && (9 < uVar1 - 0x30)) && (0x19 < uVar1 - 0x61));
      uVar1 = uVar1 - 0x80) {
    if (uVar1 < 0x20) {
      std::__cxx11::string::push_back(cVar2);
LAB_001589a3:
      std::__cxx11::string::push_back(cVar2);
      iVar4 = 2;
      goto LAB_00158a0e;
    }
    if ((int)uVar1 < 0x30) {
      std::__cxx11::string::push_back(cVar2);
      goto LAB_001589a3;
    }
    if ((int)uVar1 < 0x41) {
      std::__cxx11::string::push_back(cVar2);
      goto LAB_001589a3;
    }
    if (uVar1 - 0x5b < 5) {
      std::__cxx11::string::push_back(cVar2);
      goto LAB_001589a3;
    }
    if (uVar1 == 0x60) {
      std::__cxx11::string::push_back(cVar2);
LAB_00158a09:
      iVar4 = 2;
      std::__cxx11::string::push_back(cVar2);
      goto LAB_00158a0e;
    }
    if ((int)uVar1 < 0x5b) {
      std::__cxx11::string::push_back(cVar2);
      goto LAB_00158a09;
    }
    if ((int)uVar1 < 0x80) {
      std::__cxx11::string::push_back(cVar2);
      goto LAB_00158a09;
    }
    std::__cxx11::string::append((char *)sb);
    iVar3 = iVar3 + -2;
    iVar4 = iVar4 + -0x80;
  }
  std::__cxx11::string::push_back(cVar2);
  iVar4 = 1;
LAB_00158a0e:
  return iVar4 - iVar3;
}

Assistant:

static int EncodeChar(int c, std::string& sb)
	{
		if (c == ' ') {
			sb.push_back('\3');
			return 1;
		}
		if (c >= '0' && c <= '9') {
			sb.push_back((char)(c - 48 + 4));
			return 1;
		}
		if (c >= 'a' && c <= 'z') {
			sb.push_back((char)(c - 97 + 14));
			return 1;
		}
		if (c >= '\0' && c <= '\x1f') {
			sb.push_back('\0'); //Shift 1 Set
			sb.push_back(c);
			return 2;
		}
		if (c <= '/') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 33));
			return 2;
		}
		if (c <= '@') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 58 + 15));
			return 2;
		}
		if (c >= '[' && c <= '_') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 91 + 22));
			return 2;
		}
		if (c == '\x60') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 96));
			return 2;
		}
		if (c <= 'Z') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 65 + 1));
			return 2;
		}
		if (c <= '\x7f') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 123 + 27));
			return 2;
		}
		sb.append("\1\x1e"); //Shift 2, Upper Shift
		int len = 2;
		len += EncodeChar(c - 128, sb);
		return len;
	}